

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l2_gc.c
# Opt level: O3

void l2_gc_decrease_ref_count(l2_gc_list *gc_list_p,void *managed_mem_p)

{
  int iVar1;
  _l2_gc_mem_node *p_Var2;
  _l2_gc_mem_node *__ptr;
  _l2_gc_mem_node *p_Var3;
  
  p_Var3 = gc_list_p->head_p;
  if (p_Var3 == (_l2_gc_mem_node *)0x0) {
    l2_internal_error(L2_INTERNAL_ERROR_MEM_BLOCK_NOT_IN_GC);
  }
  if (p_Var3->managed_mem_p == managed_mem_p) {
    iVar1 = p_Var3->ref_count;
    p_Var3->ref_count = iVar1 + -1;
    if (iVar1 < 2) {
      l2_storage_mem_delete(g_parser_p->storage_p,p_Var3->managed_mem_p);
      p_Var3 = gc_list_p->head_p->next;
      free(gc_list_p->head_p);
      gc_list_p->head_p = p_Var3;
LAB_00101470:
      gc_list_p->size = gc_list_p->size + -1;
    }
  }
  else {
    for (__ptr = p_Var3->next; __ptr != (_l2_gc_mem_node *)0x0; __ptr = __ptr->next) {
      if (__ptr->managed_mem_p == managed_mem_p) {
        iVar1 = __ptr->ref_count;
        __ptr->ref_count = iVar1 + -1;
        if (1 < iVar1) {
          return;
        }
        p_Var2 = __ptr->next;
        l2_storage_mem_delete(g_parser_p->storage_p,__ptr->managed_mem_p);
        free(__ptr);
        p_Var3->next = p_Var2;
        goto LAB_00101470;
      }
      p_Var3 = p_Var3->next;
    }
  }
  return;
}

Assistant:

void l2_gc_decrease_ref_count(l2_gc_list *gc_list_p, void *managed_mem_p) {
    l2_gc_mem_node *gc_mem_node_prev_p, *gc_mem_node_p, *gc_mem_node_next_p;

    if (gc_list_p->head_p) {
        /* handle the first */
        if (gc_list_p->head_p->managed_mem_p == managed_mem_p) {
            gc_list_p->head_p->ref_count -= 1;
            if (gc_list_p->head_p->ref_count <= 0) {
                l2_storage_mem_delete(g_parser_p->storage_p, gc_list_p->head_p->managed_mem_p);
                gc_mem_node_next_p = gc_list_p->head_p->next;
                free(gc_list_p->head_p);
                gc_list_p->head_p = gc_mem_node_next_p;
                gc_list_p->size -= 1;
            }
            return;
        }

        /* handle the last */
        gc_mem_node_prev_p = gc_list_p->head_p;
        for (gc_mem_node_p = gc_list_p->head_p->next; gc_mem_node_p != L2_NULL_PTR; gc_mem_node_prev_p = gc_mem_node_prev_p->next, gc_mem_node_p = gc_mem_node_p->next) {
            if (gc_mem_node_p->managed_mem_p == managed_mem_p) {
                gc_mem_node_p->ref_count -= 1;
                if (gc_mem_node_p->ref_count <= 0) {
                    gc_mem_node_next_p = gc_mem_node_p->next;
                    l2_storage_mem_delete(g_parser_p->storage_p, gc_mem_node_p->managed_mem_p);
                    free(gc_mem_node_p);
                    gc_mem_node_prev_p->next = gc_mem_node_next_p;
                    gc_list_p->size -= 1;
                }
                return;
            }
        }
    } else {
        l2_internal_error(L2_INTERNAL_ERROR_MEM_BLOCK_NOT_IN_GC, managed_mem_p);
    }
}